

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PStruct * NewStruct(FName *name,PTypeBase *outer)

{
  PStruct *this;
  size_t bucket;
  size_t local_28;
  FName local_1c;
  
  this = (PStruct *)
         FTypeTable::FindType
                   (&TypeTable,PStruct::RegistrationInfo.MyClass,(intptr_t)outer,(long)name->Index,
                    &local_28);
  if (this == (PStruct *)0x0) {
    this = (PStruct *)DObject::operator_new(0xc0);
    local_1c = (FName)name->Index;
    PStruct::PStruct(this,&local_1c,outer);
    FTypeTable::AddType(&TypeTable,(PType *)this,PStruct::RegistrationInfo.MyClass,(intptr_t)outer,
                        (long)name->Index,local_28);
  }
  return this;
}

Assistant:

PStruct *NewStruct(FName name, PTypeBase *outer)
{
	size_t bucket;
	PType *stype = TypeTable.FindType(RUNTIME_CLASS(PStruct), (intptr_t)outer, (intptr_t)name, &bucket);
	if (stype == NULL)
	{
		stype = new PStruct(name, outer);
		TypeTable.AddType(stype, RUNTIME_CLASS(PStruct), (intptr_t)outer, (intptr_t)name, bucket);
	}
	return static_cast<PStruct *>(stype);
}